

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ImplicationConstraint * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ImplicationConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&>
          (BumpAllocator *this,Expression *args,Constraint *args_1)

{
  ImplicationConstraint *body;
  Expression *in_RDX;
  ImplicationConstraint *in_RSI;
  BumpAllocator *in_RDI;
  
  body = (ImplicationConstraint *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  ast::ImplicationConstraint::ImplicationConstraint(in_RSI,in_RDX,(Constraint *)body);
  return body;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }